

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestCaseGroup *
vkt::api::anon_unknown_1::createGroup
          (TestContext *testCtx,char *name,char *desc,CaseDescriptions *cases)

{
  deUint32 dVar1;
  VkSemaphoreCreateFlags VVar2;
  VkEventCreateFlags VVar3;
  VkFenceCreateFlags VVar4;
  VkCommandPoolCreateFlags VVar5;
  TestContext *pTVar6;
  TestContext *pTVar7;
  Parameters PVar8;
  pointer pcVar9;
  Function p_Var10;
  Parameters PVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  TestCaseGroup *pTVar17;
  TestNode *pTVar18;
  long lVar19;
  NamedParameters<vkt::api::(anonymous_namespace)::ShaderModule> *pNVar20;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorPool> *pNVar21;
  Parameters *pPVar22;
  undefined1 *puVar23;
  string *psVar24;
  NamedParameters<vkt::api::(anonymous_namespace)::Instance> *pNVar25;
  NamedParameters<vkt::api::(anonymous_namespace)::Device> *pNVar26;
  NamedParameters<vkt::api::(anonymous_namespace)::BufferView> *pNVar27;
  NamedParameters<vkt::api::(anonymous_namespace)::Image> *pNVar28;
  NamedParameters<vkt::api::(anonymous_namespace)::ImageView> *pNVar29;
  NamedParameters<vkt::api::(anonymous_namespace)::Semaphore> *pNVar30;
  NamedParameters<vkt::api::(anonymous_namespace)::Event> *pNVar31;
  NamedParameters<vkt::api::(anonymous_namespace)::Fence> *pNVar32;
  NamedParameters<vkt::api::(anonymous_namespace)::Sampler> *pNVar33;
  NamedParameters<vkt::api::(anonymous_namespace)::PipelineCache> *pNVar34;
  NamedParameters<vkt::api::(anonymous_namespace)::RenderPass> *pNVar35;
  NamedParameters<vkt::api::(anonymous_namespace)::GraphicsPipeline> *pNVar36;
  NamedParameters<vkt::api::(anonymous_namespace)::ComputePipeline> *pNVar37;
  NamedParameters<vkt::api::(anonymous_namespace)::Framebuffer> *pNVar38;
  NamedParameters<vkt::api::(anonymous_namespace)::CommandPool> *pNVar39;
  NamedParameters<vkt::api::(anonymous_namespace)::CommandBuffer> *pNVar40;
  NamedParameters<vkt::api::(anonymous_namespace)::PipelineLayout> *pNVar41;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *pNVar42;
  NamedParameters<vkt::api::(anonymous_namespace)::DescriptorSet> *pNVar43;
  byte bVar44;
  allocator<char> local_182;
  allocator<char> local_181;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  undefined1 local_170 [8];
  _Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_168;
  TestNode *local_140;
  undefined1 local_138 [8];
  undefined1 auStack_130 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined4 uStack_108;
  undefined8 uStack_104;
  undefined1 local_d0 [8];
  _Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_c8;
  string local_a0;
  undefined1 local_80 [48];
  undefined1 local_50 [32];
  
  bVar44 = 0;
  pTVar17 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar17,testCtx,name,desc);
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar17;
  for (pNVar25 = (cases->instance).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar25 != (cases->instance).paramsEnd; pNVar25 = pNVar25 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar25->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->instance).function;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8498;
    pTVar18[1].m_testCtx = pTVar6;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar26 = (cases->device).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar26 != (cases->device).paramsEnd; pNVar26 = pNVar26 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar26->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->device).function;
    PVar8 = pNVar26->parameters;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8538;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = (pointer)PVar8;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  pTVar18 = (TestNode *)(cases->deviceMemory).paramsBegin;
  while (pTVar17 = group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, pTVar18 != (TestNode *)(cases->deviceMemory).paramsEnd) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,(char *)pTVar18->_vptr_TestNode,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->deviceMemory).function;
    pcVar9 = (pointer)((Parameters *)&pTVar18->m_testCtx)->size;
    dVar1 = *(deUint32 *)&(pTVar18->m_name)._M_dataplus._M_p;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    local_140 = pTVar18;
    pTVar18 = (TestNode *)operator_new(0x90);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc85d8;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = pcVar9;
    *(deUint32 *)&pTVar18[1].m_name._M_string_length = dVar1;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
    pTVar18 = (TestNode *)&(local_140->m_name)._M_string_length;
  }
  pTVar18 = (TestNode *)(cases->buffer).paramsBegin;
  while (pTVar17 = group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, pTVar18 != (TestNode *)(cases->buffer).paramsEnd) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,(char *)pTVar18->_vptr_TestNode,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->buffer).function;
    pcVar9 = (pointer)((Parameters *)&pTVar18->m_testCtx)->size;
    dVar1 = *(deUint32 *)&(pTVar18->m_name)._M_dataplus._M_p;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    local_140 = pTVar18;
    pTVar18 = (TestNode *)operator_new(0x90);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8678;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = pcVar9;
    *(deUint32 *)&pTVar18[1].m_name._M_string_length = dVar1;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
    pTVar18 = (TestNode *)&(local_140->m_name)._M_string_length;
  }
  for (pNVar27 = (cases->bufferView).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar27 != (cases->bufferView).paramsEnd; pNVar27 = pNVar27 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,pNVar27->name,(allocator<char> *)local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"",(allocator<char> *)&local_a0);
    pTVar6 = (TestContext *)(cases->bufferView).function;
    local_118._M_allocated_capacity = (pNVar27->parameters).range;
    local_138 = (undefined1  [8])(pNVar27->parameters).buffer.size;
    auStack_130 = *(undefined1 (*) [8])&(pNVar27->parameters).buffer.usage;
    local_128._M_allocated_capacity = *(undefined8 *)&(pNVar27->parameters).format;
    local_128._8_8_ = (pNVar27->parameters).offset;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0xa8);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_170,
                       (string *)local_d0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8718;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = (pointer)local_138;
    pTVar18[1].m_name._M_string_length = (size_type)auStack_130;
    pTVar18[1].m_name.field_2._M_allocated_capacity = local_128._M_allocated_capacity;
    *(undefined8 *)((long)&pTVar18[1].m_name.field_2 + 8) = local_128._8_8_;
    pTVar18[1].m_description._M_dataplus._M_p = (pointer)local_118._M_allocated_capacity;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_170);
  }
  for (pNVar28 = (cases->image).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar28 != (cases->image).paramsEnd; pNVar28 = pNVar28 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,pNVar28->name,(allocator<char> *)local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"",(allocator<char> *)&local_a0);
    pTVar6 = (TestContext *)(cases->image).function;
    local_138 = *(undefined1 (*) [8])&pNVar28->parameters;
    auStack_130 = *(undefined1 (*) [8])&(pNVar28->parameters).format;
    local_128._0_4_ = (pNVar28->parameters).extent.height;
    local_128._4_4_ = (pNVar28->parameters).extent.depth;
    local_128._8_4_ = (pNVar28->parameters).mipLevels;
    local_128._12_4_ = (pNVar28->parameters).arraySize;
    local_118._M_allocated_capacity = *(undefined8 *)&(pNVar28->parameters).samples;
    uVar12 = (pNVar28->parameters).usage;
    uVar13 = (pNVar28->parameters).initialLayout;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    local_118._8_4_ = uVar12;
    local_118._12_4_ = uVar13;
    pTVar18 = (TestNode *)operator_new(0xb0);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_170,
                       (string *)local_d0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc87b8;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = (pointer)local_138;
    pTVar18[1].m_name._M_string_length = (size_type)auStack_130;
    pTVar18[1].m_name.field_2._M_allocated_capacity = local_128._M_allocated_capacity;
    *(undefined8 *)((long)&pTVar18[1].m_name.field_2 + 8) = local_128._8_8_;
    pTVar18[1].m_description._M_dataplus._M_p = (pointer)local_118._M_allocated_capacity;
    pTVar18[1].m_description._M_string_length = CONCAT44(local_118._12_4_,local_118._8_4_);
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_170);
  }
  for (pNVar29 = (cases->imageView).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar29 != (cases->imageView).paramsEnd; pNVar29 = pNVar29 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,pNVar29->name,(allocator<char> *)local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"",(allocator<char> *)&local_a0);
    pTVar6 = (TestContext *)(cases->imageView).function;
    pPVar22 = &pNVar29->parameters;
    puVar23 = local_138;
    for (lVar19 = 0x5c; lVar19 != 0; lVar19 = lVar19 + -1) {
      *puVar23 = (char)(pPVar22->image).flags;
      pPVar22 = (Parameters *)((long)pPVar22 + (ulong)bVar44 * -2 + 1);
      puVar23 = puVar23 + (ulong)bVar44 * -2 + 1;
    }
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0xe0);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_170,
                       (string *)local_d0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8858;
    pTVar18[1].m_testCtx = pTVar6;
    puVar23 = local_138;
    psVar24 = &pTVar18[1].m_name;
    for (lVar19 = 0x5c; lVar19 != 0; lVar19 = lVar19 + -1) {
      *(undefined1 *)&(psVar24->_M_dataplus)._M_p = *puVar23;
      puVar23 = puVar23 + (ulong)bVar44 * -2 + 1;
      psVar24 = (string *)((long)psVar24 + (ulong)bVar44 * -2 + 1);
    }
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_170);
  }
  for (pNVar30 = (cases->semaphore).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar30 != (cases->semaphore).paramsEnd; pNVar30 = pNVar30 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar30->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->semaphore).function;
    VVar2 = (pNVar30->parameters).flags;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc88f8;
    pTVar18[1].m_testCtx = pTVar6;
    *(VkSemaphoreCreateFlags *)&pTVar18[1].m_name._M_dataplus._M_p = VVar2;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar31 = (cases->event).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar31 != (cases->event).paramsEnd; pNVar31 = pNVar31 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar31->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->event).function;
    VVar3 = (pNVar31->parameters).flags;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8998;
    pTVar18[1].m_testCtx = pTVar6;
    *(VkEventCreateFlags *)&pTVar18[1].m_name._M_dataplus._M_p = VVar3;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar32 = (cases->fence).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar32 != (cases->fence).paramsEnd; pNVar32 = pNVar32 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar32->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->fence).function;
    VVar4 = (pNVar32->parameters).flags;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8a38;
    pTVar18[1].m_testCtx = pTVar6;
    *(VkFenceCreateFlags *)&pTVar18[1].m_name._M_dataplus._M_p = VVar4;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  pTVar18 = (TestNode *)(cases->queryPool).paramsBegin;
  while (pTVar17 = group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, pTVar18 != (TestNode *)(cases->queryPool).paramsEnd) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,(char *)pTVar18->_vptr_TestNode,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->queryPool).function;
    pcVar9 = (pointer)((Parameters *)&pTVar18->m_testCtx)->size;
    dVar1 = *(deUint32 *)&(pTVar18->m_name)._M_dataplus._M_p;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    local_140 = pTVar18;
    pTVar18 = (TestNode *)operator_new(0x90);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8ad8;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = pcVar9;
    *(deUint32 *)&pTVar18[1].m_name._M_string_length = dVar1;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
    pTVar18 = (TestNode *)&(local_140->m_name)._M_string_length;
  }
  for (pNVar33 = (cases->sampler).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar33 != (cases->sampler).paramsEnd; pNVar33 = pNVar33 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,pNVar33->name,(allocator<char> *)local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,"",(allocator<char> *)&local_a0);
    pTVar6 = (TestContext *)(cases->sampler).function;
    local_138 = *(undefined1 (*) [8])&pNVar33->parameters;
    auStack_130 = *(undefined1 (*) [8])&(pNVar33->parameters).mipmapMode;
    local_128._0_4_ = (pNVar33->parameters).addressModeV;
    local_128._4_4_ = (pNVar33->parameters).addressModeW;
    local_128._8_4_ = (pNVar33->parameters).mipLodBias;
    local_128._12_4_ = (pNVar33->parameters).anisotropyEnable;
    local_118._M_allocated_capacity = *(undefined8 *)&(pNVar33->parameters).maxAnisotropy;
    uVar14 = (pNVar33->parameters).compareOp;
    uVar15 = (pNVar33->parameters).minLod;
    uVar16 = (pNVar33->parameters).maxLod;
    uStack_104._0_4_ = (pNVar33->parameters).borderColor;
    uStack_104._4_4_ = (pNVar33->parameters).unnormalizedCoordinates;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    local_118._8_4_ = uVar14;
    local_118._12_4_ = uVar15;
    uStack_108 = uVar16;
    pTVar18 = (TestNode *)operator_new(0xc0);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_170,
                       (string *)local_d0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8b78;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = (pointer)local_138;
    pTVar18[1].m_name._M_string_length = (size_type)auStack_130;
    pTVar18[1].m_name.field_2._M_allocated_capacity = local_128._M_allocated_capacity;
    *(undefined8 *)((long)&pTVar18[1].m_name.field_2 + 8) = local_128._8_8_;
    pTVar18[1].m_description._M_dataplus._M_p = (pointer)local_118._M_allocated_capacity;
    pTVar18[1].m_description._M_string_length = CONCAT44(local_118._12_4_,local_118._8_4_);
    *(ulong *)((long)&pTVar18[1].m_description._M_string_length + 4) =
         CONCAT44(uStack_108,local_118._12_4_);
    *(undefined8 *)((long)&pTVar18[1].m_description.field_2 + 4) = uStack_104;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_170);
  }
  for (pNVar20 = (cases->shaderModule).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar20 != (cases->shaderModule).paramsEnd; pNVar20 = pNVar20 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pNVar20->name,&local_181)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_182);
    p_Var10 = (cases->shaderModule).function;
    ShaderModule::Parameters::Parameters((Parameters *)local_80,&pNVar20->parameters);
    pTVar6 = (pTVar17->super_TestNode).m_testCtx;
    ShaderModule::Parameters::Parameters((Parameters *)local_d0,(Parameters *)local_80);
    pTVar18 = (TestNode *)operator_new(0xa8);
    ShaderModule::Parameters::Parameters((Parameters *)local_170,(Parameters *)local_d0);
    local_138 = (undefined1  [8])p_Var10;
    ShaderModule::Parameters::Parameters((Parameters *)auStack_130,(Parameters *)local_170);
    TestCase::TestCase((TestCase *)pTVar18,pTVar6,NODETYPE_SELF_VALIDATE,&local_a0,
                       (string *)local_50);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00bc8c18;
    pTVar18[1]._vptr_TestNode = (_func_int **)ShaderModule::initPrograms;
    FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args::Args
              ((Args *)&pTVar18[1].m_testCtx,(Args *)local_138);
    std::__cxx11::string::~string((string *)(auStack_130 + 8));
    std::__cxx11::string::~string((string *)&local_168);
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  for (pNVar34 = (cases->pipelineCache).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar34 != (cases->pipelineCache).paramsEnd; pNVar34 = pNVar34 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar34->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->pipelineCache).function;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8cb8;
    pTVar18[1].m_testCtx = pTVar6;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar41 = (cases->pipelineLayout).paramsBegin; pNVar41 != (cases->pipelineLayout).paramsEnd;
      pNVar41 = pNVar41 + 1) {
    local_140 = &(group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr)->super_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pNVar41->name,&local_181)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_182);
    p_Var10 = (cases->pipelineLayout).function;
    PipelineLayout::Parameters::Parameters((Parameters *)local_80,&pNVar41->parameters);
    pTVar6 = local_140->m_testCtx;
    PipelineLayout::Parameters::Parameters((Parameters *)local_d0,(Parameters *)local_80);
    pTVar18 = (TestNode *)operator_new(0xb0);
    PipelineLayout::Parameters::Parameters((Parameters *)local_170,(Parameters *)local_d0);
    local_138 = (undefined1  [8])p_Var10;
    PipelineLayout::Parameters::Parameters((Parameters *)auStack_130,(Parameters *)local_170);
    TestCase::TestCase((TestCase *)pTVar18,pTVar6,NODETYPE_SELF_VALIDATE,&local_a0,
                       (string *)local_50);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00bc8d58;
    FunctionInstance1<vkt::api::(anonymous_namespace)::PipelineLayout::Parameters>::Args::Args
              ((Args *)&pTVar18[1].m_testCtx,(Args *)local_138);
    PipelineLayout::Parameters::~Parameters((Parameters *)auStack_130);
    PipelineLayout::Parameters::~Parameters((Parameters *)local_170);
    tcu::TestNode::addChild(local_140,pTVar18);
    PipelineLayout::Parameters::~Parameters((Parameters *)local_d0);
    PipelineLayout::Parameters::~Parameters((Parameters *)local_80);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  for (pNVar35 = (cases->renderPass).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar35 != (cases->renderPass).paramsEnd; pNVar35 = pNVar35 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar35->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->renderPass).function;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8df8;
    pTVar18[1].m_testCtx = pTVar6;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar36 = (cases->graphicsPipeline).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar36 != (cases->graphicsPipeline).paramsEnd; pNVar36 = pNVar36 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar36->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->graphicsPipeline).function;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8e98;
    pTVar18[1]._vptr_TestNode = (_func_int **)GraphicsPipeline::initPrograms;
    pTVar18[1].m_testCtx = pTVar6;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar37 = (cases->computePipeline).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar37 != (cases->computePipeline).paramsEnd; pNVar37 = pNVar37 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar37->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->computePipeline).function;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc8f38;
    pTVar18[1]._vptr_TestNode = (_func_int **)ComputePipeline::initPrograms;
    pTVar18[1].m_testCtx = pTVar6;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar42 = (cases->descriptorSetLayout).paramsBegin;
      pNVar42 != (cases->descriptorSetLayout).paramsEnd; pNVar42 = pNVar42 + 1) {
    local_140 = &(group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr)->super_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_170,pNVar42->name,&local_181)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"",&local_182);
    p_Var10 = (cases->descriptorSetLayout).function;
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_50,&(pNVar42->parameters).bindings);
    pTVar6 = local_140->m_testCtx;
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)&local_a0,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_50);
    pTVar18 = (TestNode *)operator_new(0x98);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_80,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)&local_a0);
    local_138 = (undefined1  [8])p_Var10;
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)auStack_130,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_80);
    TestCase::TestCase((TestCase *)pTVar18,pTVar6,NODETYPE_SELF_VALIDATE,(string *)local_170,
                       (string *)local_d0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00bc8fd8;
    FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>::Args::Args
              ((Args *)&pTVar18[1].m_testCtx,(Args *)local_138);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)auStack_130);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_80);
    tcu::TestNode::addChild(local_140,pTVar18);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)&local_a0);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_50);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_170);
  }
  for (pNVar21 = (cases->descriptorPool).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar21 != (cases->descriptorPool).paramsEnd; pNVar21 = pNVar21 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,pNVar21->name,&local_181);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_182);
    p_Var10 = (cases->descriptorPool).function;
    DescriptorPool::Parameters::Parameters((Parameters *)local_50,&pNVar21->parameters);
    pTVar6 = (pTVar17->super_TestNode).m_testCtx;
    DescriptorPool::Parameters::Parameters((Parameters *)local_d0,(Parameters *)local_50);
    pTVar18 = (TestNode *)operator_new(0xa0);
    DescriptorPool::Parameters::Parameters((Parameters *)local_170,(Parameters *)local_d0);
    local_138 = (undefined1  [8])p_Var10;
    DescriptorPool::Parameters::Parameters((Parameters *)auStack_130,(Parameters *)local_170);
    TestCase::TestCase((TestCase *)pTVar18,pTVar6,NODETYPE_SELF_VALIDATE,(string *)local_80,
                       &local_a0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00bc9078;
    FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::Args::Args
              ((Args *)&pTVar18[1].m_testCtx,(Args *)local_138);
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                   *)(auStack_130 + 8));
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base(&local_168);
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base(&local_c8);
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                   *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_80);
  }
  for (pNVar43 = (cases->descriptorSet).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar43 != (cases->descriptorSet).paramsEnd; pNVar43 = pNVar43 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_170,pNVar43->name,&local_181)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"",&local_182);
    p_Var10 = (cases->descriptorSet).function;
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_50,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)&pNVar43->parameters);
    pTVar6 = (pTVar17->super_TestNode).m_testCtx;
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)&local_a0,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_50);
    pTVar18 = (TestNode *)operator_new(0x98);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_80,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)&local_a0);
    local_138 = (undefined1  [8])p_Var10;
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)auStack_130,
             (vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)local_80);
    TestCase::TestCase((TestCase *)pTVar18,pTVar6,NODETYPE_SELF_VALIDATE,(string *)local_170,
                       (string *)local_d0);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory1_00bc9118;
    FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorSet::Parameters>::Args::Args
              ((Args *)&pTVar18[1].m_testCtx,(Args *)local_138);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)auStack_130);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_80);
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)&local_a0);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_50);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_170);
  }
  for (pNVar38 = (cases->framebuffer).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar38 != (cases->framebuffer).paramsEnd; pNVar38 = pNVar38 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar38->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->framebuffer).function;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc91b8;
    pTVar18[1].m_testCtx = pTVar6;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar39 = (cases->commandPool).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar39 != (cases->commandPool).paramsEnd; pNVar39 = pNVar39 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar39->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->commandPool).function;
    VVar5 = (pNVar39->parameters).flags;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc9258;
    pTVar18[1].m_testCtx = pTVar6;
    *(VkCommandPoolCreateFlags *)&pTVar18[1].m_name._M_dataplus._M_p = VVar5;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (pNVar40 = (cases->commandBuffer).paramsBegin;
      pTVar17 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                m_data.ptr, pNVar40 != (cases->commandBuffer).paramsEnd; pNVar40 = pNVar40 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,pNVar40->name,(allocator<char> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"",(allocator<char> *)local_80);
    pTVar6 = (TestContext *)(cases->commandBuffer).function;
    PVar11 = pNVar40->parameters;
    pTVar7 = (pTVar17->super_TestNode).m_testCtx;
    pTVar18 = (TestNode *)operator_new(0x88);
    TestCase::TestCase((TestCase *)pTVar18,pTVar7,NODETYPE_SELF_VALIDATE,(string *)local_138,
                       (string *)local_170);
    pTVar18->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bc92f8;
    pTVar18[1].m_testCtx = pTVar6;
    pTVar18[1].m_name._M_dataplus._M_p = (pointer)PVar11;
    tcu::TestNode::addChild(&pTVar17->super_TestNode,pTVar18);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_138);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar17;
}

Assistant:

tcu::TestCaseGroup* createGroup (tcu::TestContext& testCtx, const char* name, const char* desc, const CaseDescriptions& cases)
{
	MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, name, desc));

	addCases			(group, cases.instance);
	addCases			(group, cases.device);
	addCases			(group, cases.deviceMemory);
	addCases			(group, cases.buffer);
	addCases			(group, cases.bufferView);
	addCases			(group, cases.image);
	addCases			(group, cases.imageView);
	addCases			(group, cases.semaphore);
	addCases			(group, cases.event);
	addCases			(group, cases.fence);
	addCases			(group, cases.queryPool);
	addCases			(group, cases.sampler);
	addCasesWithProgs	(group, cases.shaderModule);
	addCases			(group, cases.pipelineCache);
	addCases			(group, cases.pipelineLayout);
	addCases			(group, cases.renderPass);
	addCasesWithProgs	(group, cases.graphicsPipeline);
	addCasesWithProgs	(group, cases.computePipeline);
	addCases			(group, cases.descriptorSetLayout);
	addCases			(group, cases.descriptorPool);
	addCases			(group, cases.descriptorSet);
	addCases			(group, cases.framebuffer);
	addCases			(group, cases.commandPool);
	addCases			(group, cases.commandBuffer);

	return group.release();
}